

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O1

void luv2lch(Triplet *in_out)

{
  double dVar1;
  double __x;
  double __y;
  double dVar2;
  double dVar3;
  
  dVar1 = in_out->a;
  __x = in_out->b;
  __y = in_out->c;
  dVar2 = __x * __x + __y * __y;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = 0.0;
  if (1e-08 <= dVar2) {
    dVar3 = atan2(__y,__x);
    dVar3 = dVar3 * 57.29577951308232;
    if (dVar3 < 0.0) {
      dVar3 = dVar3 + 360.0;
    }
  }
  in_out->a = dVar1;
  in_out->b = dVar2;
  in_out->c = dVar3;
  return;
}

Assistant:

static void
luv2lch(Triplet* in_out)
{
    double l = in_out->a;
    double u = in_out->b;
    double v = in_out->c;
    double h;
    double c = sqrt(u * u + v * v);

    /* Grays: disambiguate hue */
    if(c < 0.00000001) {
        h = 0;
    } else {
        h = atan2(v, u) * 57.29577951308232087680;  /* (180 / pi) */
        if(h < 0.0)
            h += 360.0;
    }

    in_out->a = l;
    in_out->b = c;
    in_out->c = h;
}